

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmLocalGenerator *root,cmTarget *target)

{
  cmTarget *pcVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  cmLocalGenerator *gen;
  bool local_5e;
  allocator local_49;
  string local_48;
  cmTarget *local_28;
  cmTarget *target_local;
  cmLocalGenerator *root_local;
  cmGlobalGenerator *this_local;
  
  local_28 = target;
  target_local = (cmTarget *)root;
  root_local = (cmLocalGenerator *)this;
  TVar2 = cmTarget::GetType(target);
  pcVar1 = local_28;
  local_5e = true;
  if (TVar2 != INTERFACE_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    local_5e = cmTarget::GetPropertyAsBool(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  pcVar1 = target_local;
  if (local_5e == false) {
    this_00 = cmTarget::GetMakefile(local_28);
    gen = cmMakefile::GetLocalGenerator(this_00);
    this_local._7_1_ = IsExcluded(this,(cmLocalGenerator *)pcVar1,gen);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmTarget const& target) const
{
  if(target.GetType() == cmTarget::INTERFACE_LIBRARY
      || target.GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    // This target is excluded from its directory.
    return true;
    }
  else
    {
    // This target is included in its directory.  Check whether the
    // directory is excluded.
    return this->IsExcluded(root, target.GetMakefile()->GetLocalGenerator());
    }
}